

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O0

void __thiscall BrokerSendMessage_SinglePart_Test::TestBody(BrokerSendMessage_SinglePart_Test *this)

{
  uint32_t mid;
  MockSpec<bool_(const_pstore::brokerface::message_type_&)> *this_00;
  TypedExpectation<bool_(const_pstore::brokerface::message_type_&)> *this_01;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 uStackY_578;
  message_type in_stack_fffffffffffffa90;
  ReturnAction<bool> local_440;
  Action<bool_(const_pstore::brokerface::message_type_&)> local_430;
  WithoutMatchers local_409;
  undefined8 local_408 [32];
  EqMatcher<pstore::brokerface::message_type> local_308;
  Matcher<const_pstore::brokerface::message_type_&> local_208;
  MockSpec<bool_(const_pstore::brokerface::message_type_&)> local_1f0;
  allocator local_1b9;
  string local_1b8;
  undefined1 local_198 [8];
  message_type expected;
  mock_writer wr;
  BrokerSendMessage_SinglePart_Test *this_local;
  
  bVar4 = 0;
  anon_unknown.dwarf_382ab::mock_writer::mock_writer
            ((mock_writer *)(expected.payload._M_elems + 0xec));
  mid = (this->super_BrokerSendMessage).message_id_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"hello world",&local_1b9);
  pstore::brokerface::message_type::message_type((message_type *)local_198,mid,0,1,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  memcpy(local_408,local_198,0x100);
  puVar2 = local_408;
  puVar3 = &uStackY_578;
  for (lVar1 = 0x20; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  testing::Eq<pstore::brokerface::message_type>(in_stack_fffffffffffffa90);
  testing::Matcher<pstore::brokerface::message_type_const&>::
  Matcher<testing::internal::EqMatcher<pstore::brokerface::message_type>,void>
            ((Matcher<pstore::brokerface::message_type_const&> *)&local_208,&local_308);
  anon_unknown.dwarf_382ab::mock_writer::gmock_write_impl
            (&local_1f0,(mock_writer *)(expected.payload._M_elems + 0xec),&local_208);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::operator()
                      (&local_1f0,&local_409,(void *)0x0);
  this_01 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                               ,0x39,"wr","write_impl (Eq (expected))");
  testing::Return<bool>((testing *)&local_440,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_430,(ReturnAction *)&local_440);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (this_01,&local_430);
  testing::Action<bool_(const_pstore::brokerface::message_type_&)>::~Action(&local_430);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_440);
  testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::~MockSpec
            (&local_1f0);
  testing::Matcher<const_pstore::brokerface::message_type_&>::~Matcher(&local_208);
  pstore::brokerface::send_message
            ((writer *)(expected.payload._M_elems + 0xec),true,"hello","world");
  anon_unknown.dwarf_382ab::mock_writer::~mock_writer
            ((mock_writer *)(expected.payload._M_elems + 0xec));
  return;
}

Assistant:

TEST_F (BrokerSendMessage, SinglePart) {
    using ::testing::Eq;
    using ::testing::Return;

    mock_writer wr;
    pstore::brokerface::message_type const expected{message_id_, 0, 1, "hello world"};
    EXPECT_CALL (wr, write_impl (Eq (expected))).WillOnce (Return (true));

    pstore::brokerface::send_message (wr, true /*error on timeout*/, "hello", "world");
}